

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::RangeTokenMap::setRangeToken
          (RangeTokenMap *this,XMLCh *keyword,RangeToken *tok,bool complement)

{
  RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  RuntimeException *this_00;
  RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> **ppRVar4;
  XMLCh *pXVar5;
  XMLCh XVar6;
  RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *pRVar7;
  
  pRVar1 = this->fTokenRegistry;
  if ((keyword == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*keyword, uVar3 == 0)) {
    uVar3 = 0;
  }
  else {
    XVar6 = keyword[1];
    if (XVar6 != L'\0') {
      pXVar5 = keyword + 2;
      do {
        uVar3 = (ulong)(ushort)XVar6 + (uVar3 >> 0x18) + uVar3 * 0x26;
        XVar6 = *pXVar5;
        pXVar5 = pXVar5 + 1;
      } while (XVar6 != L'\0');
    }
    uVar3 = uVar3 % pRVar1->fHashModulus;
  }
  pRVar7 = pRVar1->fBucketList[uVar3];
  if (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
    do {
      bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,keyword,pRVar7->fKey);
      if (bVar2) {
        pRVar1 = this->fTokenRegistry;
        if ((keyword == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*keyword, uVar3 == 0)) {
          uVar3 = 0;
        }
        else {
          XVar6 = keyword[1];
          if (XVar6 != L'\0') {
            pXVar5 = keyword + 2;
            do {
              uVar3 = (ulong)(ushort)XVar6 + (uVar3 >> 0x18) + uVar3 * 0x26;
              XVar6 = *pXVar5;
              pXVar5 = pXVar5 + 1;
            } while (XVar6 != L'\0');
          }
          uVar3 = uVar3 % pRVar1->fHashModulus;
        }
        ppRVar4 = pRVar1->fBucketList + uVar3;
        do {
          pRVar7 = *ppRVar4;
          bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,keyword,pRVar7->fKey);
          ppRVar4 = &pRVar7->fNext;
        } while (!bVar2);
        (&pRVar7->fData->fRange)[complement] = tok;
        return;
      }
      pRVar7 = pRVar7->fNext;
    } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0);
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RangeTokenMap.cpp"
             ,0xce,Regex_KeywordNotFound,keyword,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
             this->fTokenRegistry->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void RangeTokenMap::setRangeToken(const XMLCh* const keyword,
                                  RangeToken* const tok,const bool complement) {

    if (fTokenRegistry->containsKey(keyword)) {
        fTokenRegistry->get(keyword)->setRangeToken(tok, complement);
    }
    else {
        ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Regex_KeywordNotFound, keyword, fTokenRegistry->getMemoryManager());
    }
}